

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_STOCHRSI_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                   int *outNBElement)

{
  TA_ParamHolderOptInput *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = params->optIn;
  TVar2 = TA_STOCHRSI(startIdx,endIdx,(params->in->data).inReal,(pTVar1->data).optInInteger,
                      pTVar1[1].data.optInInteger,pTVar1[2].data.optInInteger,
                      pTVar1[3].data.optInInteger,outBegIdx,outNBElement,(params->out->data).outReal
                      ,params->out[1].data.outReal);
  return TVar2;
}

Assistant:

TA_RetCode TA_STOCHRSI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCHRSI(
/* Generated */                  startIdx,
/* Generated */                  endIdx,
/* Generated */                  params->in[0].data.inReal, /* inReal */
/* Generated */                  params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                  params->optIn[1].data.optInInteger, /* optInFastK_Period*/
/* Generated */                  params->optIn[2].data.optInInteger, /* optInFastD_Period*/
/* Generated */                  (TA_MAType)params->optIn[3].data.optInInteger, /* optInFastD_MAType*/
/* Generated */                  outBegIdx, 
/* Generated */                  outNBElement, 
/* Generated */                  params->out[0].data.outReal, /*  outFastK */
/* Generated */                  params->out[1].data.outReal /*  outFastD */ );
/* Generated */ }